

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O2

void __thiscall DBaseStatusBar::DrawTopStuff(DBaseStatusBar *this,EHudState state)

{
  int iVar1;
  int *piVar2;
  DBaseStatusBar *this_00;
  
  if ((demoplayback) && (demover != 0x21e)) {
    DCanvas::DrawText((DCanvas *)screen,SmallFont,1,0,CleanYfac * -0x28 + this->ST_Y,
                      "Demo was recorded with a different version\nof ZDoom. Expect it to go out of sync."
                      ,0x40001393,1,0);
  }
  DrawPowerups(this);
  if ((automapactive == true) && (viewactive == false)) {
    piVar2 = &ST_Y;
    if (state != HUD_StatusBar) {
      piVar2 = &(screen->super_DSimpleCanvas).super_DCanvas.Height;
    }
    DrawMessages(this,2,*piVar2);
  }
  piVar2 = &ST_Y;
  if (state != HUD_StatusBar) {
    piVar2 = &(screen->super_DSimpleCanvas).super_DCanvas.Height;
  }
  this_00 = this;
  DrawMessages(this,0,*piVar2);
  DrawConsistancy(this_00);
  DrawWaiting(this_00);
  if (this->ShowLog == true) {
    iVar1 = (*(this->super_DObject)._vptr_DObject[0x13])(this,state);
    if ((char)iVar1 != '\0') {
      DrawLog(this);
    }
  }
  if (noisedebug.Value == true) {
    S_NoiseDebug();
    return;
  }
  return;
}

Assistant:

void DBaseStatusBar::DrawTopStuff (EHudState state)
{
	if (demoplayback && demover != DEMOGAMEVERSION)
	{
		screen->DrawText (SmallFont, CR_TAN, 0, ST_Y - 40 * CleanYfac,
			"Demo was recorded with a different version\n"
			"of " GAMENAME ". Expect it to go out of sync.",
			DTA_CleanNoMove, true, TAG_DONE);
	}

	DrawPowerups ();
	if (automapactive && !viewactive)
	{
		DrawMessages (HUDMSGLayer_OverMap, (state == HUD_StatusBar) ? ::ST_Y : SCREENHEIGHT);
	}
	DrawMessages (HUDMSGLayer_OverHUD, (state == HUD_StatusBar) ? ::ST_Y : SCREENHEIGHT);
	DrawConsistancy ();
	DrawWaiting ();
	if (ShowLog && MustDrawLog(state)) DrawLog ();

	if (noisedebug)
	{
		S_NoiseDebug ();
	}
}